

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_timeouts_test.cpp
# Opt level: O1

void __thiscall async_test::binder::operator()(binder *this,completion_type ct)

{
  callback *pcVar1;
  time_t tVar2;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint i;
  callback<void_(cppcms::http::context::completion_type)> local_58;
  binder local_50;
  
  if (ct == operation_aborted) {
    async_bad_count = async_bad_count + 1;
    tVar2 = time((time_t *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"IO Completed in ",0x10);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds, timeout=",0x12);
    plVar4 = (long *)std::ostream::operator<<((ostream *)poVar3,this->timeout);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    lVar7 = tVar2 - this->start;
    lVar5 = (long)this->timeout;
    if (lVar5 * 3 < lVar7) {
      above_3to = above_3to + 1;
    }
    else if (SBORROW8(lVar7,lVar5 * 2) != lVar7 + lVar5 * -2 < 0) {
      below_2to = below_2to + 1;
    }
  }
  else {
    if (this->counter < 1) {
      cppcms::http::context::async_complete_response();
      return;
    }
    this->counter = this->counter + -1;
    cppcms::http::context::response();
    uVar6 = cppcms::http::response::out();
    lVar5 = 0;
    do {
      poVar3 = std::ostream::_M_insert<unsigned_long>(uVar6);
      local_58.call_ptr.p_._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_58,1);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 1000);
    pcVar1 = (callback *)
             (this->context).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_50.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->context).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_50.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_50.timeout = this->timeout;
    local_50.counter = this->counter;
    local_50._20_4_ = *(undefined4 *)&this->field_0x14;
    local_50.start = this->start;
    local_50.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pcVar1;
    booster::callback<void_(cppcms::http::context::completion_type)>::callback<async_test::binder>
              (&local_58,&local_50);
    cppcms::http::context::async_flush_output(pcVar1);
    booster::intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_>::
    ~intrusive_ptr(&local_58.call_ptr);
    if (local_50.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.context.
                 super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return;
}

Assistant:

void operator()(cppcms::http::context::completion_type ct)
		{
			if(ct == cppcms::http::context::operation_aborted) {
				async_bad_count++;
				time_t end = time(0);
				std::cout << "IO Completed in " << (end-start) << " seconds, timeout=" << timeout << std::endl;
				if(end - start > 3*timeout)
					above_3to ++;
				else if(end - start < 2*timeout)
					below_2to ++;
				return;
			}
			if(counter > 0) {
				counter --;
				std::ostream &out = context->response().out();
				for(unsigned i=0;i<1000;i++) {
					out << i << '\n';
				}
				context->async_flush_output(*this);
			}
			else {
				context->async_complete_response();
			}
		}